

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_KeyLog_Test::TestBody(SSLVersionTest_KeyLog_Test *this)

{
  UniquePtr<SSL> *out_client;
  _Head_base<0UL,_ssl_st_*,_false> _Var1;
  bool bVar2;
  int iVar3;
  ParamType *pPVar4;
  mapped_type *pmVar5;
  SSL_SESSION *pSVar6;
  size_t __n;
  _Head_base<0UL,_ssl_ctx_st_*,_false> __ptr_00;
  SSLVersionTest *this_00;
  SSLVersionTest *this_01;
  char *message;
  char *pcVar7;
  pointer *__ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> expected;
  uint8_t *data;
  size_t len;
  KeyLog client_log;
  KeyLog server_log;
  undefined1 local_148 [8];
  undefined1 local_140 [8];
  undefined1 local_138 [8];
  _Head_base<0UL,_ssl_st_*,_false> _Stack_130;
  undefined1 local_128 [8];
  undefined1 auStack_120 [24];
  Bytes local_108;
  undefined1 local_f8 [8];
  undefined1 auStack_f0 [16];
  char *pcStack_e0;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Head_base<0UL,_ssl_ctx_st_*,_false> local_a8;
  AssertHelper local_a0;
  _Head_base<0UL,_x509_st_*,_false> local_98;
  Bytes local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  local_50;
  
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  SSL_CTX_set_ex_data((SSL_CTX *)
                      (this->super_SSLVersionTest).client_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0,&local_80);
  SSL_CTX_set_ex_data((SSL_CTX *)
                      (this->super_SSLVersionTest).server_ctx_._M_t.
                      super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0,&local_50);
  SSL_CTX_set_keylog_callback
            ((this->super_SSLVersionTest).client_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
             TestBody::anon_class_1_0_00000001::__invoke);
  SSL_CTX_set_keylog_callback
            ((this->super_SSLVersionTest).server_ctx_._M_t.
             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
             TestBody::anon_class_1_0_00000001::__invoke);
  pcStack_e0 = (char *)0x0;
  local_d8._8_8_ = (GTestFlagSaver *)0x0;
  local_d8._24_8_ = (ssl_ctx_st *)0x0;
  local_b8._8_8_ = (ssl_st *)0x0;
  local_f8 = (undefined1  [8])0x0;
  auStack_f0._0_8_ = (ssl_ctx_st *)0x0;
  local_d8._0_8_ = (_func_int **)0x0;
  local_b8._M_allocated_capacity = 0;
  local_a8._M_head_impl = (ssl_ctx_st *)0x0;
  out_client = &(this->super_SSLVersionTest).client_;
  bVar2 = (this->super_SSLVersionTest).shed_handshake_config_;
  pcVar7 = (char *)(ulong)bVar2;
  auStack_f0._8_8_ = (SSLVersionTest *)local_d8;
  local_d8._16_8_ = &local_b8;
  bVar2 = ConnectClientAndServer
                    (out_client,&(this->super_SSLVersionTest).server_,
                     (this->super_SSLVersionTest).client_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (this->super_SSLVersionTest).server_ctx_._M_t.
                     super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     (ClientConfig *)local_f8,bVar2);
  local_128[0] = (internal)bVar2;
  auStack_120._0_8_ = (ssl_ctx_st *)0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._16_8_ != &local_b8) {
    operator_delete((void *)local_d8._16_8_,local_b8._M_allocated_capacity + 1);
  }
  this_00 = (SSLVersionTest *)auStack_f0._8_8_;
  if ((SSLVersionTest *)auStack_f0._8_8_ != (SSLVersionTest *)local_d8) {
    operator_delete((void *)auStack_f0._8_8_,(ulong)(local_d8._0_8_ + 1));
  }
  this_01 = (SSLVersionTest *)auStack_120;
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_138);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_f8,(internal *)local_128,(AssertionResult *)"Connect()","false",
               "true",pcVar7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x26cb,(char *)local_f8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
    if (local_f8 != (undefined1  [8])((long)auStack_f0 + 8)) {
      operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
    }
    __ptr_00._M_head_impl = (ssl_ctx_st *)auStack_120._0_8_;
    if ((__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_138 !=
        (__uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_138 + 8))();
      __ptr_00._M_head_impl = (ssl_ctx_st *)auStack_120._0_8_;
    }
LAB_001e1c25:
    if (__ptr_00._M_head_impl == (ssl_ctx_st *)0x0) goto LAB_001e1eb5;
  }
  else {
    if ((_Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>)auStack_120._0_8_ != (ssl_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)this_01,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_120._0_8_);
      this_00 = this_01;
    }
    bVar2 = SSLVersionTest::is_tls13(this_00);
    if (bVar2) {
      local_f8 = (undefined1  [8])0x341aca;
      auStack_f0._0_8_ = "SERVER_HANDSHAKE_TRAFFIC_SECRET";
      auStack_f0._8_8_ = "EXPORTER_SECRET";
      pcStack_e0 = "CLIENT_TRAFFIC_SECRET_0";
      local_d8._0_8_ = "CLIENT_HANDSHAKE_TRAFFIC_SECRET";
      testing::internal::
      PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>,testing::internal::KeyMatcher<char_const*>>>>
      ::operator()(local_128,local_f8,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                    *)"client_log");
      if (local_128[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_f8);
        if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)auStack_120._0_8_ ==
            (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
          message = "";
        }
        else {
          message = *(char **)auStack_120._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_138,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26d3,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
        if (local_f8 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)(RefCounted<ssl_session_st> *)local_f8 + 8))();
        }
      }
      if ((ssl_st *)auStack_120._0_8_ != (ssl_st *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_120._0_8_);
      }
      local_128 = (undefined1  [8])0x0;
      auStack_120._0_8_ = (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
      local_138 = (undefined1  [8])0x0;
      _Stack_130._M_head_impl = (ssl_st *)0x0;
      pPVar4 = testing::WithParamInterface<bssl::(anonymous_namespace)::VersionParam>::GetParam();
      if (pPVar4->ssl_method == is_dtls) {
        iVar3 = SSL_get_dtls_read_traffic_secret
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                           (uint8_t **)&local_108,(size_t *)&local_90,3);
        local_148[0] = (internal)(iVar3 != 0);
        local_140 = (undefined1  [8])0x0;
        if (iVar3 == 0) {
          testing::Message::Message((Message *)&local_98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_148,
                     (AssertionResult *)
                     "SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len, 3)","false",
                     "true",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x26db,(char *)local_f8);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
        }
        else {
          local_128 = (undefined1  [8])local_108.span_.data_;
          auStack_120._0_8_ = local_90.span_.data_;
          iVar3 = SSL_get_dtls_write_traffic_secret
                            ((out_client->_M_t).
                             super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                             (uint8_t **)&local_108,(size_t *)&local_90,3);
          local_148[0] = (internal)(iVar3 != 0);
          local_140 = (undefined1  [8])0x0;
          if (iVar3 != 0) {
            local_138 = (undefined1  [8])local_108.span_.data_;
            _Stack_130._M_head_impl = (ssl_st *)local_90.span_.data_;
            goto LAB_001e177f;
          }
          testing::Message::Message((Message *)&local_98);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_f8,(internal *)local_148,
                     (AssertionResult *)
                     "SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len, 3)","false",
                     "true",pcVar7);
          testing::internal::AssertHelper::AssertHelper
                    (&local_a0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x26de,(char *)local_f8);
          testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
        }
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if (local_f8 != (undefined1  [8])((long)auStack_f0 + 8)) {
          operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
        }
      }
      else {
        bVar2 = SSL_get_traffic_secrets
                          ((out_client->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>
                           ._M_t.super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl,
                           (Span<const_unsigned_char> *)local_128,
                           (Span<const_unsigned_char> *)local_138);
        local_148[0] = (internal)bVar2;
        local_140 = (undefined1  [8])0x0;
        if (bVar2) {
LAB_001e177f:
          local_140 = (undefined1  [8])0x0;
          local_108.span_.data_ = (uchar *)local_128;
          local_108.span_.size_ = auStack_120._0_8_;
          _Var1._M_head_impl = (ssl_st *)(auStack_f0 + 8);
          local_f8 = (undefined1  [8])_Var1._M_head_impl;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f8,"SERVER_TRAFFIC_SECRET_0","");
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 *)&local_80,(key_type *)local_f8);
          local_90.span_.data_ =
               (pmVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
          local_90.span_.size_ =
               (long)(pmVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)local_90.span_.data_;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_148,"Bytes(read_secret)",
                     "Bytes(client_log[\"SERVER_TRAFFIC_SECRET_0\"])",&local_108,&local_90);
          if (local_f8 != (undefined1  [8])_Var1._M_head_impl) {
            operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
          }
          if (local_148[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_f8);
            if (local_140 == (undefined1  [8])0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)local_140;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_108,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x26e6,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_108,(Message *)local_f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
            if (local_f8 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)(RefCounted<ssl_session_st> *)local_f8 + 8))();
            }
          }
          if (local_140 != (undefined1  [8])0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140);
          }
          local_108.span_.data_ = (uchar *)local_138;
          local_108.span_.size_ = (size_t)_Stack_130._M_head_impl;
          local_f8 = (undefined1  [8])_Var1._M_head_impl;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_f8,"CLIENT_TRAFFIC_SECRET_0","");
          pmVar5 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                                 *)&local_80,(key_type *)local_f8);
          local_90.span_.data_ =
               (pmVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
          local_90.span_.size_ =
               (long)(pmVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)local_90.span_.data_;
          testing::internal::CmpHelperEQ<Bytes,Bytes>
                    ((internal *)local_148,"Bytes(write_secret)",
                     "Bytes(client_log[\"CLIENT_TRAFFIC_SECRET_0\"])",&local_108,&local_90);
          if (local_f8 != (undefined1  [8])_Var1._M_head_impl) {
            operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
          }
          if (local_148[0] == (internal)0x0) {
            testing::Message::Message((Message *)local_f8);
            if (local_140 == (undefined1  [8])0x0) {
              pcVar7 = "";
            }
            else {
              pcVar7 = *(char **)local_140;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_108,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x26e8,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_108,(Message *)local_f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
            if (local_f8 != (undefined1  [8])0x0) {
              (**(code **)(*(long *)(RefCounted<ssl_session_st> *)local_f8 + 8))();
            }
          }
          if (local_140 != (undefined1  [8])0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)local_140,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140);
          }
          goto LAB_001e1e0e;
        }
        testing::Message::Message((Message *)&local_108);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_f8,(internal *)local_148,
                   (AssertionResult *)
                   "SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret)","false",
                   "true",pcVar7);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_90,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x26e2,(char *)local_f8);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_108);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
        local_98._M_head_impl = (x509_st *)local_108.span_.data_;
        if (local_f8 != (undefined1  [8])(auStack_f0 + 8)) {
          operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
          local_98._M_head_impl = (x509_st *)local_108.span_.data_;
        }
      }
      this_01 = (SSLVersionTest *)local_140;
      __ptr_00._M_head_impl = (ssl_ctx_st *)local_140;
      if (local_98._M_head_impl != (x509_st *)0x0) {
        (*(code *)(local_98._M_head_impl)->cert_info->serialNumber)();
        __ptr_00._M_head_impl = (ssl_ctx_st *)local_140;
      }
      goto LAB_001e1c25;
    }
    local_128 = (undefined1  [8])0x341b88;
    testing::internal::
    PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<testing::internal::KeyMatcher<char_const*>>>>
    ::operator()(local_f8,local_128,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)"client_log");
    if (local_f8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)auStack_f0._0_8_ ==
          (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)auStack_f0._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26ea,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((ssl_ctx_st *)auStack_f0._0_8_ != (ssl_ctx_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)auStack_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_f0._0_8_);
    }
    pSVar6 = SSL_get_session((SSL *)(out_client->_M_t).
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    __n = SSL_SESSION_get_master_key((SSL_SESSION *)pSVar6,(uint8_t *)0x0,0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128,__n,
               (allocator_type *)local_f8);
    pSVar6 = SSL_get_session((SSL *)(out_client->_M_t).
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
    local_138 = (undefined1  [8])
                SSL_SESSION_get_master_key
                          ((SSL_SESSION *)pSVar6,(uint8_t *)local_128,
                           auStack_120._0_8_ - (long)local_128);
    local_148 = (undefined1  [8])(auStack_120._0_8_ - (long)local_128);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_f8,
               "SSL_SESSION_get_master_key(SSL_get_session(client_.get()), expected.data(), expected.size())"
               ,"expected.size()",(unsigned_long *)local_138,(unsigned_long *)local_148);
    if (local_f8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_138);
      if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)auStack_f0._0_8_ ==
          (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)auStack_f0._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_148,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26f1,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_138);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
      if (local_138 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)local_138 + 8))();
      }
      if ((ssl_ctx_st *)auStack_f0._0_8_ != (ssl_ctx_st *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)auStack_f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     auStack_f0._0_8_);
      }
      if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )local_128 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        operator_delete((void *)local_128,auStack_120._8_8_ - (long)local_128);
      }
      goto LAB_001e1eb5;
    }
    if ((ssl_ctx_st *)auStack_f0._0_8_ != (ssl_ctx_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)auStack_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   auStack_f0._0_8_);
    }
    local_140 = (undefined1  [8])(auStack_120._0_8_ - (long)local_128);
    local_148 = local_128;
    local_f8 = (undefined1  [8])((long)auStack_f0 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"CLIENT_RANDOM","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)&local_80,(key_type *)local_f8);
    local_108.span_.data_ =
         (pmVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
    local_108.span_.size_ =
         (long)(pmVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish - (long)local_108.span_.data_;
    testing::internal::CmpHelperEQ<Bytes,Bytes>
              ((internal *)local_138,"Bytes(expected)","Bytes(client_log[\"CLIENT_RANDOM\"])",
               (Bytes *)local_148,&local_108);
    if (local_f8 != (undefined1  [8])((long)auStack_f0 + 8)) {
      operator_delete((void *)local_f8,(ulong)(auStack_f0._8_8_ + 1));
    }
    if (local_138[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_f8);
      if (_Stack_130._M_head_impl == (ssl_st *)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)_Stack_130._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_148,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26f2,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_148,(Message *)local_f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_148);
      if (local_f8 != (undefined1  [8])0x0) {
        (**(code **)(*(long *)(RefCounted<ssl_session_st> *)local_f8 + 8))();
      }
    }
    if (_Stack_130._M_head_impl != (ssl_st *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&_Stack_130,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   _Stack_130._M_head_impl);
    }
    if (local_128 != (undefined1  [8])0x0) {
      operator_delete((void *)local_128,auStack_120._8_8_ - (long)local_128);
    }
LAB_001e1e0e:
    testing::internal::
    CmpHelperEQ<std::map<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>,std::map<std::__cxx11::string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>>
              ((internal *)local_f8,"client_log","server_log",
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&local_80,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                *)&local_50);
    if (local_f8[0] == (string)0x0) {
      testing::Message::Message((Message *)local_128);
      if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)auStack_f0._0_8_ ==
          (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)auStack_f0._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x26f6,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_138,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_138);
      if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )local_128 !=
          (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           )0x0) {
        (**(code **)(*(long *)local_128 + 8))();
      }
    }
    if ((ssl_ctx_st *)auStack_f0._0_8_ == (ssl_ctx_st *)0x0) goto LAB_001e1eb5;
    this_01 = (SSLVersionTest *)auStack_f0;
    __ptr_00._M_head_impl = (ssl_ctx_st *)auStack_f0._0_8_;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this_01,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __ptr_00._M_head_impl);
LAB_001e1eb5:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&local_50);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

TEST_P(SSLVersionTest, KeyLog) {
  using KeyLog = std::map<std::string, std::vector<uint8_t>>;
  KeyLog client_log, server_log;

  SSL_CTX_set_app_data(client_ctx_.get(), &client_log);
  SSL_CTX_set_app_data(server_ctx_.get(), &server_log);

  auto keylog_callback = [](const SSL *ssl, const char *line) {
    SSL_CTX *ctx = SSL_get_SSL_CTX(ssl);
    KeyLog *log = static_cast<KeyLog *>(SSL_CTX_get_app_data(ctx));
    ASSERT_TRUE(log);

    const char *space1 = strchr(line, ' ');
    ASSERT_TRUE(space1);
    std::string name(line, space1 - line);
    space1++;
    const char *space2 = strchr(space1, ' ');
    ASSERT_TRUE(space2);
    bssl::Span<const char> client_random_hex(space1, space2 - space1);
    space2++;
    bssl::Span<const char> secret_hex(space2, strlen(space2));

    std::vector<uint8_t> client_random, secret;
    ASSERT_TRUE(DecodeLowerHex(&client_random, client_random_hex));
    ASSERT_TRUE(DecodeLowerHex(&secret, secret_hex));

    // The client_random field identifies the connection. Check it matches
    // the connection.
    uint8_t expected_random[SSL3_RANDOM_SIZE];
    ASSERT_EQ(
        sizeof(expected_random),
        SSL_get_client_random(ssl, expected_random, sizeof(expected_random)));
    ASSERT_EQ(Bytes(expected_random), Bytes(client_random));

    ASSERT_EQ(log->count(name), 0u) << "duplicate name " << name;
    log->emplace(std::move(name), std::move(secret));
  };
  SSL_CTX_set_keylog_callback(client_ctx_.get(), keylog_callback);
  SSL_CTX_set_keylog_callback(server_ctx_.get(), keylog_callback);

  // Connect and capture the various secrets.
  ASSERT_TRUE(Connect());

  // Check that we logged the secrets we expected to log.
  if (is_tls13()) {
    EXPECT_THAT(client_log, ElementsAre(Key("CLIENT_HANDSHAKE_TRAFFIC_SECRET"),
                                        Key("CLIENT_TRAFFIC_SECRET_0"),
                                        Key("EXPORTER_SECRET"),
                                        Key("SERVER_HANDSHAKE_TRAFFIC_SECRET"),
                                        Key("SERVER_TRAFFIC_SECRET_0")));

    Span<const uint8_t> read_secret, write_secret;
    if (is_dtls()) {
      // The first application data epoch is 3.
      const uint8_t *data;
      size_t len;
      ASSERT_TRUE(SSL_get_dtls_read_traffic_secret(client_.get(), &data, &len,
                                                   /*epoch=*/3));
      read_secret = Span(data, len);
      ASSERT_TRUE(SSL_get_dtls_write_traffic_secret(client_.get(), &data, &len,
                                                   /*epoch=*/3));
      write_secret = Span(data, len);
    } else {
      ASSERT_TRUE(
          SSL_get_traffic_secrets(client_.get(), &read_secret, &write_secret));
    }
    // Ideally we'd check the other values, but those are harder to check
    // without actually decrypting the records.
    EXPECT_EQ(Bytes(read_secret), Bytes(client_log["SERVER_TRAFFIC_SECRET_0"]));
    EXPECT_EQ(Bytes(write_secret),
              Bytes(client_log["CLIENT_TRAFFIC_SECRET_0"]));
  } else {
    EXPECT_THAT(client_log, ElementsAre(Key("CLIENT_RANDOM")));

    size_t len =
        SSL_SESSION_get_master_key(SSL_get0_session(client_.get()), nullptr, 0);
    std::vector<uint8_t> expected(len);
    ASSERT_EQ(SSL_SESSION_get_master_key(SSL_get0_session(client_.get()),
                                         expected.data(), expected.size()),
              expected.size());
    EXPECT_EQ(Bytes(expected), Bytes(client_log["CLIENT_RANDOM"]));
  }

  // The server should have logged the same secrets as the client.
  EXPECT_EQ(client_log, server_log);
}